

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

HighsInt __thiscall
free_format_parser::HMpsFF::getColIdx(HMpsFF *this,string *colname,bool add_if_new)

{
  bool bVar1;
  pointer ppVar2;
  byte in_DL;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_RDI;
  vector<bool,_std::allocator<bool>_> *unaff_retaddr;
  iterator mit;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffff98;
  value_type *in_stack_ffffffffffffffa8;
  value_type_conflict1 *__x;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_28;
  byte local_19;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  undefined1 __x_00;
  
  __x_00 = (undefined1)((uint)in_stack_fffffffffffffffc >> 0x18);
  local_19 = in_DL & 1;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(in_stack_ffffffffffffff98,(key_type *)0x466481);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                           *)0x4664bb);
    iVar4 = ppVar2->second;
  }
  else if ((local_19 & 1) == 0) {
    iVar4 = -1;
  }
  else {
    *(int *)((long)&in_RDI[1].super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                    _M_impl.super__Vector_impl_data._M_start + 4) =
         *(int *)((long)&in_RDI[1].super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                         _M_impl.super__Vector_impl_data._M_start + 4) + 1;
    std::
    unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::emplace<std::__cxx11::string_const&,int>
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8,(int *)in_RDI);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffa8);
    uVar3 = 0;
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::push_back
              (in_RDI,(value_type *)in_stack_ffffffffffffff98);
    std::vector<bool,_std::allocator<bool>_>::push_back(unaff_retaddr,(bool)__x_00);
    __x = (value_type_conflict1 *)0x0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_RDI,
               (value_type_conflict1 *)in_stack_ffffffffffffff98);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar3,in_stack_ffffffffffffffb0),
               __x);
    iVar4 = *(int *)((long)&in_RDI[1].
                            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                            super__Vector_impl_data._M_start + 4) + -1;
  }
  return iVar4;
}

Assistant:

HighsInt HMpsFF::getColIdx(const std::string& colname, const bool add_if_new) {
  // look up column name
  auto mit = colname2idx.find(colname);
  if (mit != colname2idx.end()) return mit->second;

  if (!add_if_new) return -1;
  // add new continuous column with default bounds
  colname2idx.emplace(colname, num_col++);
  col_names.push_back(colname);
  col_integrality.push_back(HighsVarType::kContinuous);
  col_binary.push_back(false);
  col_lower.push_back(0.0);
  col_upper.push_back(kHighsInf);

  return num_col - 1;
}